

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

int setElementTypePrefix(XML_Parser parser,ELEMENT_TYPE *elementType)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  PREFIX *pPVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar6 = elementType->name;
  do {
    if (*pcVar6 == ':') {
      pcVar5 = elementType->name;
      while( true ) {
        pcVar3 = *(char **)((long)parser + 0x348);
        if (pcVar5 == pcVar6) break;
        if (pcVar3 == *(char **)((long)parser + 0x340)) {
          iVar2 = poolGrow((STRING_POOL *)((long)parser + 0x330));
          if (iVar2 == 0) {
            return 0;
          }
          pcVar3 = *(char **)((long)parser + 0x348);
        }
        cVar1 = *pcVar5;
        *(char **)((long)parser + 0x348) = pcVar3 + 1;
        *pcVar3 = cVar1;
        pcVar5 = pcVar5 + 1;
      }
      if (pcVar3 == *(char **)((long)parser + 0x340)) {
        iVar2 = poolGrow((STRING_POOL *)((long)parser + 0x330));
        if (iVar2 == 0) {
          return 0;
        }
        pcVar3 = *(char **)((long)parser + 0x348);
      }
      *(char **)((long)parser + 0x348) = pcVar3 + 1;
      *pcVar3 = '\0';
      pPVar4 = (PREFIX *)
               lookup((HASH_TABLE *)((long)parser + 0x308),*(KEY *)((long)parser + 0x350),0x10);
      if (pPVar4 == (PREFIX *)0x0) {
        return 0;
      }
      if (pPVar4->name == *(KEY *)((long)parser + 0x350)) {
        *(undefined8 *)((long)parser + 0x350) = *(undefined8 *)((long)parser + 0x348);
      }
      else {
        *(KEY *)((long)parser + 0x348) = *(KEY *)((long)parser + 0x350);
      }
      elementType->prefix = pPVar4;
    }
    else if (*pcVar6 == '\0') {
      return 1;
    }
    pcVar6 = pcVar6 + 1;
  } while( true );
}

Assistant:

static int setElementTypePrefix(XML_Parser parser, ELEMENT_TYPE *elementType)
{
  const XML_Char *name;
  for (name = elementType->name; *name; name++) {
    if (*name == XML_T(':')) {
      PREFIX *prefix;
      const XML_Char *s;
      for (s = elementType->name; s != name; s++) {
        if (!poolAppendChar(&dtd.pool, *s))
          return 0;
      }
      if (!poolAppendChar(&dtd.pool, XML_T('\0')))
        return 0;
      prefix = (PREFIX *)lookup(&dtd.prefixes, poolStart(&dtd.pool), sizeof(PREFIX));
      if (!prefix)
        return 0;
      if (prefix->name == poolStart(&dtd.pool))
        poolFinish(&dtd.pool);
      else
        poolDiscard(&dtd.pool);
      elementType->prefix = prefix;

    }
  }
  return 1;
}